

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

void __thiscall ON_OffsetSurface::~ON_OffsetSurface(ON_OffsetSurface *this)

{
  ON_OffsetSurface *this_local;
  
  (this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b76038;
  ON_OffsetSurfaceFunction::SetBaseSurface(&this->m_offset_function,(ON_Surface *)0x0);
  if (((this->m__pSrf != (ON_Surface *)0x0) && (this != (ON_OffsetSurface *)this->m__pSrf)) &&
     (this->m__pSrf != (ON_Surface *)0x0)) {
    (*(this->m__pSrf->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
  }
  this->m__pSrf = (ON_Surface *)0x0;
  ON_OffsetSurfaceFunction::~ON_OffsetSurfaceFunction(&this->m_offset_function);
  ON_SurfaceProxy::~ON_SurfaceProxy(&this->super_ON_SurfaceProxy);
  return;
}

Assistant:

ON_OffsetSurface::~ON_OffsetSurface()
{
  m_offset_function.SetBaseSurface( 0 );
  if ( 0 != m__pSrf && this != m__pSrf )
    delete m__pSrf;
  m__pSrf = 0;
  
}